

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O2

void MARGINAL::make_marginal<true>(data *sm,example *ec)

{
  features *pfVar1;
  byte bVar2;
  byte bVar3;
  float *pfVar4;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar5;
  data *pdVar6;
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *this;
  features *pfVar7;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  iterator iVar8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  ostream *poVar11;
  uint64_t *puVar12;
  long lVar13;
  long lVar14;
  ulong i;
  float *pfVar15;
  features *pfVar16;
  uint64_t *puVar17;
  features *pfVar18;
  features *pfVar19;
  ulong *puVar20;
  byte bVar21;
  float fVar22;
  float extraout_XMM0_Da;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::pair<double,_double>_>,_false,_false>,_bool>
  pVar23;
  uint64_t key;
  double local_118;
  data *local_110;
  float local_108;
  float local_104;
  features *local_100;
  byte *local_f8;
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_f0;
  example *local_e8;
  undefined8 local_e0;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 uStack_d0;
  undefined4 local_cc;
  features *local_c8;
  vw *local_c0;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_b8;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_b0;
  uint64_t local_a8;
  features *local_a0;
  uint64_t local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined4 local_84;
  undefined8 local_80;
  
  bVar21 = 0;
  local_c0 = sm->all;
  puVar12 = &(local_c0->weights).dense_weights._weight_mask;
  if ((local_c0->weights).sparse != false) {
    puVar12 = &(local_c0->weights).sparse_weights._weight_mask;
  }
  local_a8 = *puVar12;
  local_108 = (ec->l).simple.label;
  local_100 = (ec->super_example_predict).feature_space;
  sm->average_pred = 0.0;
  sm->net_weight = 0.0;
  sm->net_feature_weight = 0.0;
  sm->alg_loss = 0.0;
  local_f8 = (ec->super_example_predict).indices._begin;
  local_c8 = sm->temp;
  local_b0 = &(sm->marginals)._M_h;
  local_f0 = (_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&sm->expert_state;
  local_110 = sm;
  local_e8 = ec;
  do {
    pfVar7 = local_c8;
    if (local_f8 == (local_e8->super_example_predict).indices._end) {
      return;
    }
    bVar2 = *local_f8;
    if (local_110->id_features[bVar2] == true) {
      pfVar1 = local_c8 + bVar2;
      pfVar19 = local_100 + bVar2;
      puVar12 = &local_98;
      pfVar16 = pfVar1;
      puVar17 = puVar12;
      for (lVar13 = 0xd; lVar13 != 0; lVar13 = lVar13 + -1) {
        *puVar17 = (uint64_t)(pfVar16->values)._begin;
        pfVar16 = (features *)((long)pfVar16 + (ulong)bVar21 * -0x10 + 8);
        puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
      }
      lVar13 = 100;
      pfVar16 = pfVar19;
      pfVar18 = pfVar1;
      for (lVar14 = lVar13; lVar14 != 0; lVar14 = lVar14 + -1) {
        *(undefined1 *)&(pfVar18->values)._begin = *(undefined1 *)&(pfVar16->values)._begin;
        pfVar16 = (features *)((long)pfVar16 + (ulong)bVar21 * -2 + 1);
        pfVar18 = (features *)((long)pfVar18 + (ulong)bVar21 * -2 + 1);
      }
      for (; lVar13 != 0; lVar13 = lVar13 + -1) {
        *(char *)&(pfVar19->values)._begin = (char)*puVar12;
        puVar12 = (uint64_t *)((long)puVar12 + (ulong)bVar21 * -2 + 1);
        pfVar19 = (features *)((long)pfVar19 + (ulong)bVar21 * -2 + 1);
      }
      bVar3 = *local_f8;
      pfVar19 = local_100 + bVar3;
      features::clear(pfVar19);
      local_b8 = &local_100[bVar3].space_names;
      puVar20 = pfVar7[bVar2].indicies._begin + 1;
      local_a0 = pfVar19;
      for (pfVar15 = pfVar7[bVar2].values._begin; this_00 = local_b0, pfVar4 = (pfVar1->values)._end
          , pfVar15 != pfVar4; pfVar15 = pfVar15 + 2) {
        if (pfVar15 + 1 == pfVar4) {
          poVar11 = std::operator<<((ostream *)&std::cout,"warning: id feature namespace has ");
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
          poVar11 = std::operator<<(poVar11," features. Should be a multiple of 2");
          std::endl<char,std::char_traits<char>>(poVar11);
          break;
        }
        if ((((*pfVar15 != 1.0) || (NAN(*pfVar15))) || (fVar22 = pfVar15[1], fVar22 != 1.0)) ||
           (NAN(fVar22))) {
          poVar11 = std::operator<<((ostream *)&std::cout,
                                    "warning: bad id features, must have value 1.");
          std::endl<char,std::char_traits<char>>(poVar11);
        }
        else {
          i = puVar20[-1] & local_a8;
          key = (*puVar20 & local_a8) + (local_e8->super_example_predict).ft_offset;
          iVar8 = std::
                  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(local_b0,&key);
          pdVar6 = local_110;
          if (iVar8.
              super__Node_iterator_base<std::pair<const_unsigned_long,_std::pair<double,_double>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            local_90._0_4_ = local_110->initial_numerator;
            local_90._4_4_ = local_110->initial_denominator;
            local_98 = key;
            pVar23 = std::
                     _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<double,double>>,std::allocator<std::pair<unsigned_long_const,std::pair<double,double>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                     ::_M_emplace<std::pair<unsigned_long,std::pair<float,float>>>
                               ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<double,double>>,std::allocator<std::pair<unsigned_long_const,std::pair<double,double>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                 *)this_00,&local_98);
            if (pdVar6->compete == true) {
              local_e0 = 0;
              local_d8 = 0x3f800000;
              local_d4 = 0;
              uStack_d0 = 0;
              local_cc = 0x3f800000;
              local_98 = key;
              local_80 = 0x3f80000000000000;
              local_90 = 0;
              local_88 = 0x3f800000;
              local_84 = 0;
              std::
              _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<std::pair<unsigned_long,std::pair<MARGINAL::expert,MARGINAL::expert>>>
                        (local_f0,&local_98,pVar23._8_8_);
            }
          }
          pmVar9 = std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)this_00,&key);
          local_118 = pmVar9->first;
          pmVar9 = std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)this_00,&key);
          pfVar7 = local_a0;
          fVar22 = (float)(local_118 / pmVar9->second);
          local_118 = (double)CONCAT44(local_118._4_4_,fVar22);
          features::push_back(local_a0,fVar22,i);
          psVar5 = (pfVar1->space_names)._begin;
          if (psVar5 != (pfVar1->space_names)._end) {
            v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::push_back(local_b8,(shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)((long)psVar5 +
                                    ((long)(pfVar7->values)._end - (long)(pfVar7->values)._begin) *
                                    8 + -0x20));
          }
          this = local_f0;
          if (local_110->compete == true) {
            pmVar10 = std::__detail::
                      _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)local_f0,&key);
            pdVar6 = local_110;
            local_104 = (pmVar10->first).weight;
            local_110->average_pred = local_104 * local_118._0_4_ + local_110->average_pred;
            local_110->net_weight = local_110->net_weight + local_104;
            pmVar10 = std::__detail::
                      _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this,&key);
            pdVar6->net_feature_weight = (pmVar10->second).weight + pdVar6->net_feature_weight;
            (*local_c0->loss->_vptr_loss_function[1])
                      (local_118._0_4_,local_108,local_c0->loss,local_c0->sd);
            pdVar6->alg_loss = extraout_XMM0_Da * local_104 + pdVar6->alg_loss;
          }
        }
        puVar20 = puVar20 + 2;
      }
    }
    local_f8 = local_f8 + 1;
  } while( true );
}

Assistant:

void make_marginal(data& sm, example& ec)
{
  uint64_t mask = sm.all->weights.mask();
  float label = ec.l.simple.label;
  vw& all = *sm.all;
  sm.alg_loss = 0.;
  sm.net_weight = 0.;
  sm.net_feature_weight = 0.;
  sm.average_pred = 0.;

  for (example::iterator i = ec.begin(); i != ec.end(); ++i)
  {
    namespace_index n = i.index();
    if (sm.id_features[n])
    {
      std::swap(sm.temp[n], *i);
      features& f = *i;
      f.clear();
      for (features::iterator j = sm.temp[n].begin(); j != sm.temp[n].end(); ++j)
      {
        float first_value = j.value();
        uint64_t first_index = j.index() & mask;
        if (++j == sm.temp[n].end())
        {
          cout << "warning: id feature namespace has " << sm.temp[n].size() << " features. Should be a multiple of 2"
               << endl;
          break;
        }
        float second_value = j.value();
        uint64_t second_index = j.index() & mask;
        if (first_value != 1. || second_value != 1.)
        {
          cout << "warning: bad id features, must have value 1." << endl;
          continue;
        }
        uint64_t key = second_index + ec.ft_offset;
        if (sm.marginals.find(key) == sm.marginals.end())  // need to initialize things.
        {
          sm.marginals.insert(make_pair(key, make_pair(sm.initial_numerator, sm.initial_denominator)));
          if (sm.compete)
          {
            expert e = {0, 0, 1.};
            sm.expert_state.insert(make_pair(key, make_pair(e, e)));
          }
        }
        float marginal_pred = (float)(sm.marginals[key].first / sm.marginals[key].second);
        f.push_back(marginal_pred, first_index);
        if (!sm.temp[n].space_names.empty())
          f.space_names.push_back(sm.temp[n].space_names[2 * (f.size() - 1)]);

        if (sm.compete)  // compute the prediction from the marginals using the weights
        {
          float weight = sm.expert_state[key].first.weight;
          sm.average_pred += weight * marginal_pred;
          sm.net_weight += weight;
          sm.net_feature_weight += sm.expert_state[key].second.weight;
          if (is_learn)
            sm.alg_loss += weight * all.loss->getLoss(all.sd, marginal_pred, label);
        }
      }
    }
  }
}